

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintNgeneric.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintNgeneric::ArchiveOUT(ChConstraintNgeneric *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChConstraintNgeneric>(marchive);
  ChConstraint::ArchiveOUT(&this->super_ChConstraint,marchive);
  return;
}

Assistant:

void ChConstraintNgeneric::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChConstraintNgeneric>();

    // serialize the parent class data too
    ChConstraint::ArchiveOUT(marchive);

    // serialize all member data:
    // NOTHING INTERESTING TO SERIALIZE
}